

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O3

void __thiscall
capnp::anon_unknown_59::ThrowingErrorReporter::addError
          (ThrowingErrorReporter *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  ulong uVar1;
  int line;
  ulong uVar2;
  bool bVar3;
  StringPtr *in_stack_fffffffffffffe28;
  size_t sStack_1d0;
  ArrayDisposer *local_1c8;
  int local_1c0;
  int local_1bc;
  char *local_1b8;
  size_t local_1b0;
  Exception local_1a8;
  
  local_1b0 = message.content.size_;
  local_1b8 = message.content.ptr;
  if (startByte == 0) {
    line = 1;
    local_1c0 = 0;
  }
  else {
    uVar2 = 0;
    line = 1;
    uVar1 = 0;
    do {
      bVar3 = (this->input).content.ptr[uVar2] == '\n';
      if (bVar3) {
        uVar1 = uVar2 & 0xffffffff;
      }
      local_1c0 = (int)uVar1;
      line = line + (uint)bVar3;
      uVar2 = uVar2 + 1;
    } while (startByte != uVar2);
  }
  local_1bc = startByte - local_1c0;
  local_1c0 = endByte - local_1c0;
  kj::str<unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[3],kj::StringPtr&>
            ((String *)&stack0xfffffffffffffe28,(kj *)&local_1bc,(uint *)0x52b2d8,
             (char (*) [2])&local_1c0,(uint *)0x588789,(char (*) [3])&local_1b8,
             in_stack_fffffffffffffe28);
  kj::Exception::Exception
            (&local_1a8,FAILED,"(capnp text input)",line,(String *)&stack0xfffffffffffffe28);
  kj::throwRecoverableException(&local_1a8,0);
  kj::Exception::~Exception(&local_1a8);
  if (in_stack_fffffffffffffe28 != (StringPtr *)0x0) {
    (**local_1c8->_vptr_ArrayDisposer)
              (local_1c8,in_stack_fffffffffffffe28,1,sStack_1d0,sStack_1d0,0);
  }
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
    // Note: Line and column numbers are usually 1-based.
    uint line = 1;
    uint32_t lineStart = 0;
    for (auto i: kj::zeroTo(startByte)) {
      if (input[i] == '\n') {
        ++line;
        lineStart = i;  // Omit +1 so that column is 1-based.
      }
    }

    kj::throwRecoverableException(kj::Exception(
      kj::Exception::Type::FAILED, "(capnp text input)", line,
      kj::str(startByte - lineStart, "-", endByte - lineStart, ": ", message)
    ));
  }